

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_353748f::DumpVisitor::onStartCompileUnit(DumpVisitor *this,Unit *CU)

{
  uint64_t uVar1;
  Unit *CU_local;
  DumpVisitor *this_local;
  
  writeInitialLength(&CU->Length,this->OS,
                     (bool)(((this->super_ConstVisitor).
                             super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
                            IsLittleEndian & 1));
  uVar1 = llvm::raw_ostream::tell(this->OS);
  this->StartPos = uVar1;
  writeInteger<unsigned_short>
            (CU->Version,this->OS,
             (bool)(((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.
                    DebugInfo)->IsLittleEndian & 1));
  if (CU->Version < 5) {
    writeInteger<unsigned_int>
              (CU->AbbrOffset,this->OS,
               (bool)(((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.
                      DebugInfo)->IsLittleEndian & 1));
    writeInteger<unsigned_char>
              (CU->AddrSize,this->OS,
               (bool)(((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.
                      DebugInfo)->IsLittleEndian & 1));
  }
  else {
    writeInteger<unsigned_char>
              (CU->Type,this->OS,
               (bool)(((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.
                      DebugInfo)->IsLittleEndian & 1));
    writeInteger<unsigned_char>
              (CU->AddrSize,this->OS,
               (bool)(((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.
                      DebugInfo)->IsLittleEndian & 1));
    writeInteger<unsigned_int>
              (CU->AbbrOffset,this->OS,
               (bool)(((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.
                      DebugInfo)->IsLittleEndian & 1));
  }
  return;
}

Assistant:

void onStartCompileUnit(const DWARFYAML::Unit &CU) override {
    writeInitialLength(CU.Length, OS, DebugInfo.IsLittleEndian);
    StartPos = OS.tell(); // XXX BINARYEN
    writeInteger((uint16_t)CU.Version, OS, DebugInfo.IsLittleEndian);
    if(CU.Version >= 5) {
      writeInteger((uint8_t)CU.Type, OS, DebugInfo.IsLittleEndian);
      writeInteger((uint8_t)CU.AddrSize, OS, DebugInfo.IsLittleEndian);
      writeInteger((uint32_t)CU.AbbrOffset, OS, DebugInfo.IsLittleEndian);
    }else {
      writeInteger((uint32_t)CU.AbbrOffset, OS, DebugInfo.IsLittleEndian);
      writeInteger((uint8_t)CU.AddrSize, OS, DebugInfo.IsLittleEndian);
    }
  }